

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.h
# Opt level: O1

LIndex __thiscall
PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agI,Index ts)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)agI;
  pvVar1 = (this->_m_firstOHIforT).
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_m_firstOHIforT).
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar5 = uVar4;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    uVar5 = (ulong)ts;
    lVar2 = *(long *)&pvVar1[uVar4].
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data;
    uVar3 = (long)*(pointer *)
                   ((long)&pvVar1[uVar4].
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3;
    if (uVar5 < uVar3) {
      return *(LIndex *)(lVar2 + uVar5 * 8);
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar3
            );
}

Assistant:

LIndex GetFirstObservationHistoryIndex(Index agI, Index ts) const
        {return _m_firstOHIforT.at(agI).at(ts);}